

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [64];
  pointer pbVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  int32_t k;
  int iVar7;
  int32_t iVar8;
  int *piVar9;
  long lVar10;
  ostream *poVar11;
  pointer pbVar12;
  int iVar13;
  ulong uVar14;
  real threshold;
  double dVar15;
  shared_ptr<const_fasttext::Dictionary> dict;
  FastText fasttext;
  ifstream ifs;
  Dictionary *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  FastText local_338;
  undefined1 local_2b8 [32];
  undefined1 local_298 [24];
  __buckets_ptr pp_Stack_280;
  size_type sStack_278;
  undefined1 auStack_270 [16];
  float fStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [16];
  bool local_248;
  string local_238 [16];
  
  iVar6 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1));
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
  if (((long)uVar14 >> 5) - 7U < 0xfffffffffffffffd) {
    if (iVar6 == 0) {
      printTestLabelUsage();
      goto LAB_0011b7bd;
    }
LAB_0011b7b8:
    printTestUsage();
    goto LAB_0011b7bd;
  }
  k = 1;
  pbVar12 = pbVar3;
  if (4 < (ulong)((long)uVar14 >> 5)) {
    pcVar4 = pbVar3[4]._M_dataplus._M_p;
    piVar9 = __errno_location();
    iVar7 = *piVar9;
    *piVar9 = 0;
    lVar10 = strtol(pcVar4,(char **)local_238,10);
    if (local_238[0]._M_dataplus._M_p == pcVar4) {
      std::__throw_invalid_argument("stoi");
      goto LAB_0011b7b8;
    }
    iVar13 = *piVar9;
    if ((int)lVar10 != lVar10 || iVar13 == 0x22) {
      lVar10 = std::__throw_out_of_range("stoi");
    }
    k = (int32_t)lVar10;
    if (iVar13 == 0) {
      *piVar9 = iVar7;
    }
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12;
  }
  threshold = 0.0;
  if (0xa0 < uVar14) {
    pcVar4 = pbVar12[5]._M_dataplus._M_p;
    piVar9 = __errno_location();
    iVar7 = *piVar9;
    *piVar9 = 0;
    threshold = strtof(pcVar4,(char **)local_238);
    if (local_238[0]._M_dataplus._M_p == pcVar4) {
      std::__throw_invalid_argument("stof");
    }
    if (*piVar9 != 0) {
      if (*piVar9 != 0x22) goto LAB_0011b872;
      std::__throw_out_of_range("stof");
    }
    *piVar9 = iVar7;
  }
LAB_0011b872:
  ::fasttext::FastText::FastText(&local_338);
  ::fasttext::FastText::loadModel(&local_338,pbVar3 + 2);
  pp_Stack_280 = (__buckets_ptr)(local_258 + 8);
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  uStack_25c = auVar2._60_4_;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_2b8 = auVar2._0_32_;
  local_298 = auVar2._32_24_;
  sStack_278 = 1;
  auStack_270 = (undefined1  [16])0x0;
  fStack_260 = 1.0;
  local_258 = (undefined1  [16])0x0;
  local_248 = false;
  iVar7 = std::__cxx11::string::compare((char *)(pbVar3 + 3));
  if (iVar7 == 0) {
    ::fasttext::FastText::test(&local_338,(istream *)&std::cin,k,threshold,(Meter *)local_2b8);
  }
  else {
    std::ifstream::ifstream(local_238,(string *)(pbVar3 + 3),_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Test file cannot be opened!",0x1b);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0011b7bd:
      exit(1);
    }
    ::fasttext::FastText::test(&local_338,(istream *)local_238,k,threshold,(Meter *)local_2b8);
    std::ifstream::~ifstream(local_238);
  }
  lVar10 = std::cout;
  if (iVar6 == 0) {
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar10 + -0x18)) = 6;
    ::fasttext::FastText::getDictionary(&local_338);
    paVar1 = &local_238[0].field_2;
    iVar6 = 0;
    while( true ) {
      iVar8 = ::fasttext::Dictionary::nlabels(local_348);
      if (iVar8 <= iVar6) break;
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"F1-Score","");
      dVar15 = ::fasttext::Meter::f1Score((Meter *)local_2b8,iVar6);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," : ",3);
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Precision","");
      dVar15 = ::fasttext::Meter::precision((Meter *)local_2b8,iVar6);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," : ",3);
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Recall","");
      dVar15 = ::fasttext::Meter::recall((Meter *)local_2b8,iVar6);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," : ",3);
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      ::fasttext::Dictionary::getLabel_abi_cxx11_(local_238,local_348,iVar6);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      iVar6 = iVar6 + 1;
    }
    if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
    }
  }
  ::fasttext::Meter::writeGeneralMetrics((Meter *)local_2b8,(ostream *)&std::cout,k);
  exit(0);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter(false);

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}